

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DeferredTypeHandlerBase::Convert
          (DeferredTypeHandlerBase *this,DynamicObject *instance,DeferredInitializeMode mode,
          int initSlotCapacity,BOOL hasAccessor)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  DynamicType *this_00;
  DynamicTypeHandler *pDVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *newTypeHandler;
  BOOL isSimple;
  BOOL isProto;
  BOOL hasAccessor_local;
  int initSlotCapacity_local;
  DeferredInitializeMode mode_local;
  DynamicObject *instance_local;
  DeferredTypeHandlerBase *this_local;
  
  this_00 = DynamicObject::GetDynamicType(instance);
  pDVar4 = DynamicType::GetTypeHandler(this_00);
  if (pDVar4 != &this->super_DynamicTypeHandler) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x50,"(instance->GetDynamicType()->GetTypeHandler() == this)",
                                "instance->GetDynamicType()->GetTypeHandler() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  bVar2 = hasAccessor == 0;
  isProto = initSlotCapacity;
  if (mode != DeferredInitializeMode_Extensions) {
    if (mode == DeferredInitializeMode_Set) {
      isProto = initSlotCapacity + 1;
      goto LAB_013dcfe5;
    }
    if (mode != DeferredInitializeMode_SetAccessors) goto LAB_013dcfe5;
    isProto = initSlotCapacity + 2;
  }
  bVar2 = false;
LAB_013dcfe5:
  if (bVar2) {
    ConvertToSimpleDictionaryType(this,instance,isProto,bVar3 & 0x20);
  }
  else {
    ConvertToDictionaryType(this,instance,isProto,bVar3 & 0x20);
  }
  bVar2 = DynamicObject::HasSharedType(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x6d,"(!instance->HasSharedType())",
                                "Expect the instance to have a non-shared type and handler after conversion."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DeferredTypeHandlerBase::Convert(DynamicObject * instance, DeferredInitializeMode mode, int initSlotCapacity, BOOL hasAccessor)
    {
        Assert(instance->GetDynamicType()->GetTypeHandler() == this);

        BOOL isProto = (GetFlags() & IsPrototypeFlag);
        BOOL isSimple = !hasAccessor;

        switch (mode)
        {
        case DeferredInitializeMode_Set:
            initSlotCapacity++;
            break;
        case DeferredInitializeMode_SetAccessors:
            initSlotCapacity += 2;
            // fall-through
        case DeferredInitializeMode_Extensions:
            isSimple = FALSE;
            break;
        }

        DynamicTypeHandler* newTypeHandler;

        if (isSimple)
        {
            newTypeHandler = ConvertToSimpleDictionaryType(instance, initSlotCapacity, isProto);
        }
        else
        {
            newTypeHandler = ConvertToDictionaryType(instance, initSlotCapacity, isProto);
        }

        AssertMsg(!instance->HasSharedType(), "Expect the instance to have a non-shared type and handler after conversion.");
    }